

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::ConcurrentDatabase::get_hash_list_for_resource_tag
          (ConcurrentDatabase *this,ResourceTag tag,size_t *num_hashes,Hash *hashes)

{
  ExportedMetadataHeader *pEVar1;
  size_type sVar2;
  DatabaseInterface *pDVar3;
  ulong uVar4;
  int iVar5;
  Hash *pHVar6;
  __node_base *p_Var7;
  size_t sVar8;
  size_t writeonly_size;
  long local_38;
  
  uVar4 = (ulong)tag;
  pEVar1 = ((this->super_DatabaseInterface).impl)->imported_concurrent_metadata;
  if (pEVar1 == (ExportedMetadataHeader *)0x0) {
    sVar2 = this->primed_hashes[uVar4]._M_h._M_element_count;
    local_38 = 0;
    pDVar3 = (this->writeonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar3 == (DatabaseInterface *)0x0) ||
       (iVar5 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,uVar4,&local_38,0), (char)iVar5 == '\0'
       )) {
      local_38 = 0;
    }
    sVar8 = sVar2 + local_38;
    if (hashes != (Hash *)0x0) {
      if (sVar8 == *num_hashes) {
        p_Var7 = &this->primed_hashes[uVar4]._M_h._M_before_begin;
        pHVar6 = hashes;
        while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
          *pHVar6 = (Hash)p_Var7[1]._M_nxt;
          pHVar6 = pHVar6 + 1;
        }
        if ((local_38 == 0) ||
           (pDVar3 = (this->writeonly_interface)._M_t.
                     super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl,
           iVar5 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,uVar4,&local_38),
           (char)iVar5 != '\0')) {
          std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(hashes,hashes + sVar8);
          return true;
        }
      }
      return false;
    }
    *num_hashes = sVar8;
  }
  else {
    sVar8 = pEVar1->lists[uVar4].count;
    if (hashes == (Hash *)0x0) {
      *num_hashes = sVar8;
    }
    else {
      if (sVar8 != *num_hashes) {
        return false;
      }
      memcpy(hashes,(void *)((long)&((ExportedMetadataHeader *)(pEVar1->lists + -1))->magic +
                            pEVar1->lists[uVar4].offset),sVar8 << 3);
    }
  }
  return true;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *num_hashes, Hash *hashes) override
	{
		if (impl->imported_concurrent_metadata)
		{
			size_t total_size = impl->imported_concurrent_metadata->lists[tag].count;

			if (hashes)
			{
				if (total_size != *num_hashes)
					return false;
			}
			else
				*num_hashes = total_size;

			if (hashes)
			{
				memcpy(hashes,
				       reinterpret_cast<const uint8_t *>(impl->imported_concurrent_metadata) +
				       impl->imported_concurrent_metadata->lists[tag].offset,
				       total_size * sizeof(*hashes));
			}
			return true;
		}

		size_t readonly_size = primed_hashes[tag].size();

		size_t writeonly_size = 0;
		if (!writeonly_interface || !writeonly_interface->get_hash_list_for_resource_tag(tag, &writeonly_size, nullptr))
			writeonly_size = 0;

		size_t total_size = readonly_size + writeonly_size;

		if (hashes)
		{
			if (total_size != *num_hashes)
				return false;
		}
		else
			*num_hashes = total_size;

		if (hashes)
		{
			Hash *iter = hashes;
			for (auto &blob : primed_hashes[tag])
				*iter++ = blob;

			if (writeonly_size != 0 && !writeonly_interface->get_hash_list_for_resource_tag(tag, &writeonly_size, iter))
				return false;

			// Make replay more deterministic.
			sort(hashes, hashes + total_size);
		}

		return true;
	}